

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O0

uint32_t __thiscall
bits::detail::
RadixSort<8U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<8U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,unsigned_long *keys_in,unsigned_long *keys_temp,uint *values_in,uint *values_temp,
          uint32_t size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  uint in_R9D;
  uint32_t in_2;
  uint32_t bucket_5;
  uint32_t in_1;
  uint32_t bucket_4;
  uint32_t in;
  uint32_t bucket_3;
  uint32_t out;
  uint *values [2];
  unsigned_long *keys [2];
  uint32_t bucket_2;
  uint32_t i_1;
  uint32_t tsum;
  uint32_t bucket_1;
  uint32_t sum [8];
  uint32_t pos;
  uint32_t shift;
  uint32_t bucket;
  unsigned_long key;
  uint32_t i;
  uint32_t hist [8] [256];
  PassThrough pass_through;
  PassThrough encode_op;
  PassThrough decode_op;
  uint local_20bc;
  long local_20a8 [4];
  uint local_2088;
  uint local_2084;
  int local_2080;
  uint local_207c;
  int aiStack_2078 [9];
  uint local_2054;
  int local_2050;
  uint local_204c;
  unsigned_long local_2048;
  uint local_203c;
  int local_2038 [1792];
  undefined1 auStack_438 [1035];
  PassThrough local_2d;
  uint local_2c;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_2038,0,0x2000);
  for (local_203c = 0; local_203c < local_2c; local_203c = local_203c + 1) {
    local_2048 = PassThrough::operator()
                           (&local_2d,*(unsigned_long *)(local_10 + (ulong)local_203c * 8));
    for (local_204c = 0; local_204c < 8; local_204c = local_204c + 1) {
      local_2050 = local_204c << 3;
      local_2054 = (uint)(local_2048 >> ((byte)(local_204c << 3) & 0x3f)) & 0xff;
      local_2038[(ulong)local_204c * 0x100 + (ulong)local_2054] =
           local_2038[(ulong)local_204c * 0x100 + (ulong)local_2054] + 1;
    }
  }
  for (local_207c = 0; local_207c < 8; local_207c = local_207c + 1) {
    aiStack_2078[local_207c] = local_2038[(ulong)local_207c * 0x100];
    local_2038[(ulong)local_207c * 0x100] = 0;
  }
  for (local_2084 = 1; local_2084 < 0x100; local_2084 = local_2084 + 1) {
    for (local_2088 = 0; local_2088 < 8; local_2088 = local_2088 + 1) {
      iVar1 = local_2038[(ulong)local_2088 * 0x100 + (ulong)local_2084];
      iVar2 = aiStack_2078[local_2088];
      local_2080 = iVar1 + iVar2;
      local_2038[(ulong)local_2088 * 0x100 + (ulong)local_2084] = aiStack_2078[local_2088];
      aiStack_2078[local_2088] = iVar1 + iVar2;
    }
  }
  local_20a8[2] = local_10;
  local_20a8[3] = local_18;
  local_20a8[0] = local_20;
  local_20a8[1] = local_28;
  RadixSort<8u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_10,local_18,local_20,local_28,local_2c,local_2038,0);
  for (local_20bc = 1; local_20bc < 7; local_20bc = local_20bc + 1) {
    uVar3 = local_20bc & 1;
    uVar4 = (uint)((uVar3 != 0 ^ 0xffU) & 1);
    RadixSort<8u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
    radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
              (local_20a8[(ulong)uVar3 + 2],local_20a8[(ulong)uVar4 + 2],local_20a8[uVar3],
               local_20a8[uVar4],local_2c,local_2038 + (ulong)local_20bc * 0x100,local_20bc << 3);
  }
  RadixSort<8u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_20a8[3],local_20a8[2],local_20a8[1],local_20a8[0],local_2c,auStack_438,0x38);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }